

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MatryoshkaDAG.cpp
# Opt level: O1

DomainSet * __thiscall
MatryoshkaDAG::extractDomains
          (DomainSet *__return_storage_ptr__,MatryoshkaDAG *this,size_t i,float areaCovered)

{
  pointer *ppDVar1;
  size_t sVar2;
  iterator iVar3;
  double dVar4;
  reference pdVar5;
  size_t l;
  float fVar6;
  float fVar7;
  Domain local_48;
  
  (__return_storage_ptr__->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  l = this->params->n;
  if ((areaCovered != -1.0) || (NAN(areaCovered))) {
    do {
      sVar2 = *(size_t *)
               (*(long *)&(this->OPT).
                          super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[l].
                          super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                          ._M_impl.super__Vector_impl_data + 8 + i * 0x18);
      dVar4 = q(this,sVar2,l);
      if (0.0 < dVar4) {
        fVar6 = log10f(areaCovered / (float)(l - sVar2));
        pdVar5 = boost::numeric::ublas::
                 symmetric_matrix<double,_boost::numeric::ublas::basic_upper<unsigned_long>,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>
                 ::operator()(&this->params->sums,sVar2 - 1,l - 1);
        fVar7 = log10f((float)*pdVar5);
        Domain::Domain(&local_48,sVar2 - 1,l - 1,fVar7 * fVar6);
        iVar3._M_current =
             (__return_storage_ptr__->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (__return_storage_ptr__->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Domain,_std::allocator<Domain>_>::_M_realloc_insert<Domain>
                    (__return_storage_ptr__,iVar3,&local_48);
        }
        else {
          (iVar3._M_current)->weight = local_48.weight;
          *(undefined4 *)&(iVar3._M_current)->field_0x14 = local_48._20_4_;
          (iVar3._M_current)->start = local_48.start;
          (iVar3._M_current)->end = local_48.end;
          ppDVar1 = &(__return_storage_ptr__->super__Vector_base<Domain,_std::allocator<Domain>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppDVar1 = *ppDVar1 + 1;
        }
      }
      l = sVar2 - 1;
    } while (1 < l);
  }
  else {
    do {
      sVar2 = *(size_t *)
               (*(long *)&(this->OPT).
                          super__Vector_base<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>,_std::allocator<std::vector<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[l].
                          super__Vector_base<MatryoshkaDAG::SubProblem,_std::allocator<MatryoshkaDAG::SubProblem>_>
                          ._M_impl.super__Vector_impl_data + 8 + i * 0x18);
      dVar4 = q(this,sVar2,l);
      if (0.0 < dVar4) {
        Domain::Domain(&local_48,sVar2 - 1,l - 1);
        iVar3._M_current =
             (__return_storage_ptr__->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (__return_storage_ptr__->super__Vector_base<Domain,_std::allocator<Domain>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<Domain,_std::allocator<Domain>_>::_M_realloc_insert<Domain>
                    (__return_storage_ptr__,iVar3,&local_48);
        }
        else {
          (iVar3._M_current)->weight = local_48.weight;
          *(undefined4 *)&(iVar3._M_current)->field_0x14 = local_48._20_4_;
          (iVar3._M_current)->start = local_48.start;
          (iVar3._M_current)->end = local_48.end;
          ppDVar1 = &(__return_storage_ptr__->super__Vector_base<Domain,_std::allocator<Domain>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppDVar1 = *ppDVar1 + 1;
        }
      }
      l = sVar2 - 1;
    } while (1 < l);
  }
  return __return_storage_ptr__;
}

Assistant:

DomainSet MatryoshkaDAG::extractDomains(size_t i, float areaCovered) {
    size_t k,l;
    DomainSet dset;

    float ratio, weight;

    l = params->n;
    if (areaCovered == -1) {    
        do {
            k = OPT[l][i].backPointer;
            if (q(k,l) > 0) {
                dset.push_back(Domain(k-1,l-1)); 
            }
            l = k-1;
        } while(l > 1);
    }
    else {
        do {
            k = OPT[l][i].backPointer;
            if (q(k,l) > 0) {
                ratio = log10(areaCovered/float(l-k));
                weight = log10(float(params->sums(k-1, l-1))) * ratio;
                dset.push_back(Domain(k-1, l-1, weight)); 
            }
            l = k-1;
        } while(l > 1);
    }
    
    return dset;
}